

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O0

uint64_t mse_8xh_16bit_highbd_sse2(uint16_t *dst,int dstride,uint16_t *src,int sstride,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint6 uVar7;
  uint in_ECX;
  ulong in_RDX;
  ulong uVar8;
  longlong in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i v;
  __m128i sum_1x64;
  int i;
  __m128i square_result;
  __m128i zeros;
  __m128i sub_result_8x16;
  __m128i res3_4x64;
  __m128i res2_4x64;
  __m128i res1_4x64;
  __m128i res0_4x64;
  __m128i res1_4x32;
  __m128i res0_4x32;
  __m128i dst_8x16;
  __m128i src_8x16;
  uint64_t sum;
  int local_2dc;
  long local_2d8;
  long lStack_2d0;
  undefined1 local_268 [12];
  short sStack_25c;
  undefined1 local_258 [12];
  short sStack_24c;
  uint64_t local_220 [3];
  int local_204;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  long local_b8;
  undefined8 uStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  ulong local_78;
  ulong uStack_70;
  long local_68;
  long lStack_60;
  ulong local_58;
  ulong uStack_50;
  long local_48;
  long lStack_40;
  ulong local_38;
  ulong uStack_30;
  ulong local_28;
  ulong uStack_20;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_204 = (int)in_RSI;
  local_220[0] = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_2d8 = 0;
  lStack_2d0 = 0;
  uVar8 = in_RDX;
  for (local_2dc = 0; local_2dc < in_R8D; local_2dc = local_2dc + 1) {
    local_8 = (undefined8 *)(in_RDI + (long)(local_2dc * local_204) * 2);
    uVar1 = *local_8;
    uVar2 = local_8[1];
    uVar8 = (ulong)in_ECX;
    local_10 = (undefined8 *)(in_RDX + (long)(int)(local_2dc * in_ECX) * 2);
    uVar3 = *local_10;
    uVar4 = local_10[1];
    local_1c8._0_2_ = (short)uVar3;
    local_1c8._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_1c8._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_1c8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_1c0._0_2_ = (short)uVar4;
    uStack_1c0._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_1c0._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_1c0._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_1d8._0_2_ = (short)uVar1;
    local_1d8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_1d8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_1d8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_1d0._0_2_ = (short)uVar2;
    uStack_1d0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_1d0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_1d0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_258._0_2_ = (short)local_1c8 - (short)local_1d8;
    local_258._4_2_ = local_1c8._2_2_ - local_1d8._2_2_;
    local_258._8_2_ = local_1c8._4_2_ - local_1d8._4_2_;
    sStack_24c = local_1c8._6_2_ - local_1d8._6_2_;
    local_268._0_2_ = (short)uStack_1c0 - (short)uStack_1d0;
    local_268._4_2_ = uStack_1c0._2_2_ - uStack_1d0._2_2_;
    local_268._8_2_ = uStack_1c0._4_2_ - uStack_1d0._4_2_;
    sStack_25c = uStack_1c0._6_2_ - uStack_1d0._6_2_;
    local_1a8 = CONCAT26(sStack_24c,
                         CONCAT24(local_258._8_2_,CONCAT22(local_258._4_2_,local_258._0_2_)));
    uStack_1a0 = CONCAT26(sStack_25c,
                          CONCAT24(local_268._8_2_,CONCAT22(local_268._4_2_,local_268._0_2_)));
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_258._2_2_ = 0;
    local_258._6_2_ = 0;
    local_258._10_2_ = 0;
    local_188 = CONCAT26(sStack_24c,
                         CONCAT24(local_258._8_2_,CONCAT22(local_258._4_2_,local_258._0_2_)));
    uStack_180 = CONCAT26(sStack_25c,
                          CONCAT24(local_268._8_2_,CONCAT22(local_268._4_2_,local_268._0_2_)));
    local_198 = 0;
    uStack_190 = 0;
    local_268._2_2_ = 0;
    local_268._6_2_ = 0;
    local_268._10_2_ = 0;
    local_158 = local_258._0_8_;
    uVar7 = local_258._8_6_;
    stack0xfffffffffffffdb0 = (ulong)uVar7;
    uStack_150 = stack0xfffffffffffffdb0;
    auVar6._8_6_ = uVar7;
    auVar6._0_8_ = local_258._0_8_;
    auVar6._14_2_ = 0;
    auVar9._8_6_ = uVar7;
    auVar9._0_8_ = local_258._0_8_;
    auVar9._14_2_ = 0;
    auVar9 = pmaddwd(auVar6,auVar9);
    local_178 = local_268._0_8_;
    uVar7 = local_268._8_6_;
    stack0xfffffffffffffda0 = (ulong)uVar7;
    uStack_170 = stack0xfffffffffffffda0;
    auVar5._8_6_ = uVar7;
    auVar5._0_8_ = local_268._0_8_;
    auVar5._14_2_ = 0;
    auVar10._8_6_ = uVar7;
    auVar10._0_8_ = local_268._0_8_;
    auVar10._14_2_ = 0;
    auVar10 = pmaddwd(auVar5,auVar10);
    local_258._0_8_ = auVar9._0_8_;
    stack0xfffffffffffffdb0 = auVar9._8_8_;
    uStack_100 = stack0xfffffffffffffdb0;
    local_118 = 0;
    uStack_110 = 0;
    local_108._0_4_ = auVar9._0_4_;
    local_108._4_4_ = auVar9._4_4_;
    local_c8 = local_258._0_8_;
    local_d8 = 0;
    uStack_d0 = 0;
    uStack_c0._0_4_ = auVar9._8_4_;
    uStack_c0._4_4_ = auVar9._12_4_;
    local_268._0_8_ = auVar10._0_8_;
    stack0xfffffffffffffda0 = auVar10._8_8_;
    uStack_120 = stack0xfffffffffffffda0;
    local_138 = 0;
    uStack_130 = 0;
    local_128._0_4_ = auVar10._0_4_;
    local_128._4_4_ = auVar10._4_4_;
    local_e8 = local_268._0_8_;
    local_f8 = 0;
    uStack_f0 = 0;
    uStack_e0._0_4_ = auVar10._8_4_;
    uStack_e0._4_4_ = auVar10._12_4_;
    local_88 = local_2d8;
    lStack_80 = lStack_2d0;
    local_28 = (ulong)(uint)local_108;
    uStack_20 = (ulong)local_108._4_4_;
    local_38 = (ulong)(uint)uStack_c0;
    uStack_30 = (ulong)uStack_c0._4_4_;
    local_48 = local_28 + local_38;
    lStack_40 = uStack_20 + uStack_30;
    local_58 = (ulong)(uint)local_128;
    uStack_50 = (ulong)local_128._4_4_;
    local_68 = local_48 + local_58;
    lStack_60 = lStack_40 + uStack_50;
    local_78 = (ulong)(uint)uStack_e0;
    uStack_70 = (ulong)uStack_e0._4_4_;
    local_98 = local_68 + local_78;
    lStack_90 = lStack_60 + uStack_70;
    local_2d8 = local_2d8 + local_98;
    lStack_2d0 = lStack_2d0 + lStack_90;
    local_1d8 = uVar1;
    uStack_1d0 = uVar2;
    local_1c8 = uVar3;
    uStack_1c0 = uVar4;
    local_168 = local_178;
    uStack_160 = uStack_170;
    local_148 = local_158;
    uStack_140 = uStack_150;
    local_128 = local_268._0_8_;
    local_108 = local_258._0_8_;
    uStack_e0 = stack0xfffffffffffffda0;
    uStack_c0 = stack0xfffffffffffffdb0;
  }
  local_a8 = local_2d8;
  lStack_a0 = lStack_2d0;
  local_b8 = lStack_2d0;
  uStack_b0 = 0;
  v[1] = uVar8;
  v[0] = in_RSI;
  xx_storel_64(local_220,v);
  return local_220[0];
}

Assistant:

static uint64_t mse_8xh_16bit_highbd_sse2(uint16_t *dst, int dstride,
                                          uint16_t *src, int sstride, int h) {
  uint64_t sum = 0;
  __m128i src_8x16;
  __m128i dst_8x16;
  __m128i res0_4x32, res1_4x32, res0_4x64, res1_4x64, res2_4x64, res3_4x64;
  __m128i sub_result_8x16;
  const __m128i zeros = _mm_setzero_si128();
  __m128i square_result = _mm_setzero_si128();

  for (int i = 0; i < h; i++) {
    dst_8x16 = _mm_loadu_si128((__m128i *)&dst[i * dstride]);
    src_8x16 = _mm_loadu_si128((__m128i *)&src[i * sstride]);

    sub_result_8x16 = _mm_sub_epi16(src_8x16, dst_8x16);

    res0_4x32 = _mm_unpacklo_epi16(sub_result_8x16, zeros);
    res1_4x32 = _mm_unpackhi_epi16(sub_result_8x16, zeros);

    res0_4x32 = _mm_madd_epi16(res0_4x32, res0_4x32);
    res1_4x32 = _mm_madd_epi16(res1_4x32, res1_4x32);

    res0_4x64 = _mm_unpacklo_epi32(res0_4x32, zeros);
    res1_4x64 = _mm_unpackhi_epi32(res0_4x32, zeros);
    res2_4x64 = _mm_unpacklo_epi32(res1_4x32, zeros);
    res3_4x64 = _mm_unpackhi_epi32(res1_4x32, zeros);

    square_result = _mm_add_epi64(
        square_result,
        _mm_add_epi64(
            _mm_add_epi64(_mm_add_epi64(res0_4x64, res1_4x64), res2_4x64),
            res3_4x64));
  }

  const __m128i sum_1x64 =
      _mm_add_epi64(square_result, _mm_srli_si128(square_result, 8));
  xx_storel_64(&sum, sum_1x64);
  return sum;
}